

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_added_data(Terminal *term,_Bool called_from_term_data)

{
  _Bool called_from_term_data_local;
  Terminal *term_local;
  
  if ((term->in_term_out & 1U) == 0) {
    term->in_term_out = true;
    term_reset_cblink(term);
    term_out(term,called_from_term_data);
    term->in_term_out = false;
  }
  return;
}

Assistant:

static void term_added_data(Terminal *term, bool called_from_term_data)
{
    if (!term->in_term_out) {
        term->in_term_out = true;
        term_reset_cblink(term);
        term_out(term, called_from_term_data);
        term->in_term_out = false;
    }
}